

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O2

int chrono::collision::addContactPoint
              (cbtVector3 *pc,int iface,cbtVector3 *hdims,cbtTransform *X_box,
              cbtManifoldResult *resultOut)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  cbtScalar cVar4;
  undefined1 auVar7 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar8 [64];
  undefined1 auVar11 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  cbtVector3 cVar12;
  cbtVector3 local_68;
  cbtVector3 p;
  cbtVector3 point;
  cbtVector3 normal;
  
  if ((iface != 0) && (iface + 3U < 7)) {
    bVar1 = bt_utils::PointInsideBox(hdims,pc);
    iVar2 = 0;
    if (bVar1) {
      p.m_floats._0_8_ = *(undefined8 *)pc->m_floats;
      p.m_floats._8_8_ = *(undefined8 *)(pc->m_floats + 2);
      local_68.m_floats = (cbtScalar  [4])(ZEXT816(0) << 0x20);
      if (iface < 1) {
        uVar3 = ~iface;
        cVar4 = hdims->m_floats[(int)uVar3];
        (&p)[-1].m_floats[(int)uVar3] = -1.0;
        p.m_floats[(int)uVar3] = -cVar4;
        auVar8 = ZEXT1664(CONCAT412(0x80000000,
                                    CONCAT48(0x80000000,
                                             CONCAT44(0x80000000,-pc->m_floats[(int)uVar3]))));
      }
      else {
        uVar3 = iface - 1;
        cVar4 = hdims->m_floats[uVar3];
        (&p)[-1].m_floats[uVar3] = 1.0;
        p.m_floats[uVar3] = cVar4;
        auVar8 = ZEXT464((uint)pc->m_floats[uVar3]);
      }
      auVar11 = auVar8._8_56_;
      auVar7 = (undefined1  [56])0x0;
      cVar12 = ::operator*(&X_box->m_basis,&local_68);
      auVar9._0_8_ = cVar12.m_floats._8_8_;
      auVar9._8_56_ = auVar11;
      auVar5._0_8_ = cVar12.m_floats._0_8_;
      auVar5._8_56_ = auVar7;
      normal.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar5._0_16_,auVar9._0_16_);
      auVar7 = ZEXT856(normal.m_floats._8_8_);
      cVar12 = cbtTransform::operator()(X_box,&p);
      auVar10._0_8_ = cVar12.m_floats._8_8_;
      auVar10._8_56_ = auVar11;
      auVar6._0_8_ = cVar12.m_floats._0_8_;
      auVar6._8_56_ = auVar7;
      vmovlhps_avx(auVar6._0_16_,auVar10._0_16_);
      (*(resultOut->super_Result)._vptr_Result[4])
                ((ulong)(uint)(auVar8._0_4_ - cVar4),resultOut,&normal);
      iVar2 = 1;
    }
    return iVar2;
  }
  __assert_fail("iface >= -3 && iface <= +3 && iface != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionAlgorithmsBullet.cpp"
                ,0xfc,
                "int chrono::collision::addContactPoint(const cbtVector3 &, int, const cbtVector3 &, const cbtTransform &, cbtManifoldResult *)"
               );
}

Assistant:

int addContactPoint(const cbtVector3& pc,
                    int iface,
                    const cbtVector3& hdims,
                    const cbtTransform& X_box,
                    cbtManifoldResult* resultOut) {
    assert(iface >= -3 && iface <= +3 && iface != 0);

    // No contact if point outside box
    if (!bt_utils::PointInsideBox(hdims, pc))
        return 0;  // no contacts added

    // Find point projection on box face and calculate normal and penetration
    // (still working in the box frame)
    cbtVector3 p = pc;
    cbtVector3 n(0, 0, 0);
    cbtScalar penetration;
    if (iface > 0) {
        // "positive" box face
        int i = iface - 1;
        p[i] = hdims[i];
        n[i] = 1;
        penetration = pc[i] - hdims[i];
    } else {
        // "negative" box face
        int i = -iface - 1;
        p[i] = -hdims[i];
        n[i] = -1;
        penetration = -pc[i] - hdims[i];
    }

    // A new contact point must specify (in absolute frame):
    //   normal, pointing from B towards A
    //   point, located on surface of B
    //   distance, negative for penetration
    cbtVector3 normal = X_box.getBasis() * n;
    cbtVector3 point = X_box(p);
    resultOut->addContactPoint(normal, point, penetration);

    ////std::cout << "add contact     nrm = " << normal.x() << " " << normal.y() << " " << normal.z() << std::endl;
    ////std::cout << "                pnt = " << point.x() << " " << point.y() << " " << point.z() << std::endl;
    ////std::cout << "                pen = " << penetration << std::endl;

    return 1;  // one contact added
}